

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O1

bool crnlib::string_to_bool(char *p,bool *value)

{
  bool bVar1;
  int iVar2;
  uint v;
  char *q;
  uint local_24;
  char *local_20;
  
  *value = false;
  iVar2 = strcasecmp(p,"false");
  if (iVar2 == 0) {
    return true;
  }
  iVar2 = strcasecmp(p,"true");
  if (iVar2 == 0) {
LAB_00168b78:
    bVar1 = true;
    *value = true;
  }
  else {
    local_20 = p;
    bVar1 = string_to_uint(&local_20,&local_24);
    if (bVar1) {
      if (local_24 == 0) {
        return true;
      }
      if (local_24 == 1) goto LAB_00168b78;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool string_to_bool(const char* p, bool& value) {
  CRNLIB_ASSERT(p);

  value = false;

  if (crnlib_stricmp(p, "false") == 0)
    return true;

  if (crnlib_stricmp(p, "true") == 0) {
    value = true;
    return true;
  }

  const char* q = p;
  uint v;
  if (string_to_uint(q, v)) {
    if (!v)
      return true;
    else if (v == 1) {
      value = true;
      return true;
    }
  }

  return false;
}